

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O1

char * SoapySDRDevice_readSensor(SoapySDRDevice *device,char *key)

{
  undefined1 *puVar1;
  char *pcVar2;
  allocator local_61;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  char *local_40 [2];
  char local_30 [16];
  
  puVar1 = (undefined1 *)__tls_get_addr(&PTR_0013ef28);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 0x400) = 0;
  std::__cxx11::string::string((string *)local_60,key,&local_61);
  (**(code **)(*(long *)device + 0x298))(local_40,device,local_60);
  pcVar2 = strdup(local_40[0]);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
  }
  return pcVar2;
}

Assistant:

char *SoapySDRDevice_readSensor(const SoapySDRDevice *device, const char *key)
{
    __SOAPY_SDR_C_TRY
    return strdup(device->readSensor(key).c_str());
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}